

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O2

bool CoreML::Specification::vectorsEqual<CoreML::Specification::StringVector>
               (StringVector *a,StringVector *b)

{
  int iVar1;
  bool bVar2;
  Type *__lhs;
  Type *__rhs;
  int i;
  int index;
  bool bVar3;
  
  index = 0;
  bVar3 = false;
  if ((a->vector_).super_RepeatedPtrFieldBase.current_size_ ==
      (b->vector_).super_RepeatedPtrFieldBase.current_size_) {
    do {
      iVar1 = (a->vector_).super_RepeatedPtrFieldBase.current_size_;
      bVar3 = iVar1 <= index;
      if (iVar1 <= index) {
        return bVar3;
      }
      __lhs = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (&(a->vector_).super_RepeatedPtrFieldBase,index);
      __rhs = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (&(b->vector_).super_RepeatedPtrFieldBase,index);
      bVar2 = std::operator!=(__lhs,__rhs);
      index = index + 1;
    } while (!bVar2);
  }
  return bVar3;
}

Assistant:

bool operator!=(const CoreML::Specification::FeatureVectorizer_InputColumn& a,
                        const CoreML::Specification::FeatureVectorizer_InputColumn& b) {
            return !(a == b);
        }